

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_format.h
# Opt level: O0

string * ST::format<unsigned_char>(string *__return_storage_ptr__,char *fmt_str,uchar *args)

{
  undefined1 local_148 [8];
  string_format_writer data;
  uchar *args_local;
  char *fmt_str_local;
  
  data.m_output.m_stack._248_8_ = args;
  _ST_PRIVATE::string_format_writer::string_format_writer((string_format_writer *)local_148,fmt_str)
  ;
  apply_format<unsigned_char>((format_writer *)local_148,(uchar *)data.m_output.m_stack._248_8_);
  _ST_PRIVATE::string_format_writer::to_string
            (__return_storage_ptr__,(string_format_writer *)local_148,true,check_validity);
  _ST_PRIVATE::string_format_writer::~string_format_writer((string_format_writer *)local_148);
  return __return_storage_ptr__;
}

Assistant:

ST_NODISCARD
    string format(const char *fmt_str, args_T &&...args)
    {
        _ST_PRIVATE::string_format_writer data(fmt_str);
        apply_format(data, std::forward<args_T>(args)...);
        return data.to_string(true, ST_DEFAULT_VALIDATION);
    }